

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O1

float128 propagateFloat128NaN(float128 a,float128 b,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  float128 fVar11;
  
  uVar4 = b.high;
  uVar6 = b.low;
  uVar7 = a.high;
  uVar8 = a.low;
  bVar9 = 2;
  bVar10 = 2;
  if (((~uVar7 & 0x7fff000000000000) == 0) &&
     (bVar10 = 2,
     ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 || uVar8 != 0
     )) {
    bVar10 = (((undefined1  [16])a & (undefined1  [16])0x7fffffffffff) == (undefined1  [16])0x0 &&
              uVar8 == 0 || (uVar7 & 0x7fff800000000000) != 0x7fff000000000000) ^ 5;
  }
  if (((~uVar4 & 0x7fff000000000000) == 0) &&
     (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
      uVar6 != 0)) {
    bVar9 = (((undefined1  [16])b & (undefined1  [16])0x7fffffffffff) == (undefined1  [16])0x0 &&
             uVar6 == 0 || (uVar4 & 0x7fff800000000000) != 0x7fff000000000000) ^ 5;
  }
  if ((bVar10 == 5) || (bVar9 == 5)) {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  if (status->default_nan_mode != '\0') {
    uVar6 = 0;
    uVar8 = 0x7fff800000000000;
    goto LAB_00d051d1;
  }
  uVar1 = uVar7 * 2;
  uVar2 = uVar4 * 2;
  bVar5 = true;
  if ((uVar2 <= uVar1) && (uVar6 <= uVar8 || uVar1 != uVar2)) {
    bVar5 = (uVar4 <= uVar7 && uVar1 <= uVar2) && (uVar8 <= uVar6 || uVar1 != uVar2);
  }
  if (bVar10 == 4) {
    if (bVar9 != 5) {
      bVar3 = (bool)(bVar9 == 4 & bVar5);
      goto LAB_00d051a8;
    }
LAB_00d051bd:
    uVar6 = uVar8;
    uVar8 = uVar7 | 0x800000000000;
    if (bVar10 != 5) {
      uVar8 = uVar7;
    }
  }
  else {
    if (bVar10 == 5) {
      bVar3 = bVar9 == 4;
      if (bVar9 == 5) {
        bVar3 = bVar5;
      }
LAB_00d051a8:
      if (!bVar3) goto LAB_00d051bd;
    }
    uVar8 = uVar4 | 0x800000000000;
    if (bVar9 != 5) {
      uVar8 = uVar4;
    }
  }
LAB_00d051d1:
  fVar11.high = uVar8;
  fVar11.low = uVar6;
  return fVar11;
}

Assistant:

static float128 propagateFloat128NaN(float128 a, float128 b,
                                     float_status *status)
{
    flag aIsLargerSignificand;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!float128_is_any_nan(a)
             ? float_class_normal
             : float128_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!float128_is_any_nan(b)
             ? float_class_normal
             : float128_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return float128_default_nan(status);
    }

    if (lt128(a.high << 1, a.low, b.high << 1, b.low)) {
        aIsLargerSignificand = 0;
    } else if (lt128(b.high << 1, b.low, a.high << 1, a.low)) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (a.high < b.high) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return float128_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return float128_silence_nan(a, status);
        }
        return a;
    }
}